

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O0

int op_kill(lua_State *L)

{
  int off;
  undefined1 local_b8 [4];
  int len;
  buffer buf;
  char *cursor_id;
  size_t cursor_len;
  lua_State *L_local;
  
  cursor_id = (char *)0x0;
  cursor_len = (size_t)L;
  buf.buffer._120_8_ = luaL_tolstring(L,1,(size_t *)&cursor_id);
  if (cursor_id == (char *)0x8) {
    buffer_create((buffer *)local_b8);
    off = reserve_length((buffer *)local_b8);
    write_int32((buffer *)local_b8,0);
    write_int32((buffer *)local_b8,0);
    write_int32((buffer *)local_b8,0x7d7);
    write_int32((buffer *)local_b8,0);
    write_int32((buffer *)local_b8,1);
    write_bytes((buffer *)local_b8,(void *)buf.buffer._120_8_,8);
    write_length((buffer *)local_b8,(int32_t)local_b8,off);
    lua_pushlstring((lua_State *)cursor_len,(char *)buf._0_8_,(long)(int)local_b8);
    buffer_destroy((buffer *)local_b8);
    L_local._4_4_ = 1;
  }
  else {
    L_local._4_4_ = luaL_error((lua_State *)cursor_len,"Invalid cursor id");
  }
  return L_local._4_4_;
}

Assistant:

static int
op_kill(lua_State *L) {
	size_t cursor_len = 0;
	const char * cursor_id = luaL_tolstring(L, 1, &cursor_len);
	if (cursor_len != 8) {
		return luaL_error(L, "Invalid cursor id");
	}

	struct buffer buf;
	buffer_create(&buf);

	int len = reserve_length(&buf);
	write_int32(&buf, 0);
	write_int32(&buf, 0);
	write_int32(&buf, OP_KILL_CURSORS);

	write_int32(&buf, 0);
	write_int32(&buf, 1);
	write_bytes(&buf, cursor_id, 8);

	write_length(&buf, buf.size, len);

	lua_pushlstring(L, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);

	return 1;
}